

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

bool EpsilonCompare<aiVectorKey>(aiVectorKey *n,aiVectorKey *s,ai_real epsilon)

{
  if ((epsilon < ABS((n->mValue).x - (s->mValue).x)) &&
     (epsilon < ABS((n->mValue).y - (s->mValue).y))) {
    return epsilon < ABS((n->mValue).z - (s->mValue).z);
  }
  return false;
}

Assistant:

bool EpsilonCompare<aiVectorKey>(const aiVectorKey& n, const aiVectorKey& s, ai_real epsilon) {
    return
        EpsilonCompare(n.mValue.x,s.mValue.x,epsilon) &&
        EpsilonCompare(n.mValue.y,s.mValue.y,epsilon) &&
        EpsilonCompare(n.mValue.z,s.mValue.z,epsilon);
}